

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb_hexamine.cc
# Opt level: O1

int parse_options(int argc,char **argv,input_option *opt)

{
  char *__s1;
  int iVar1;
  int iVar2;
  
  iVar2 = -1;
  if (argc < 2) {
LAB_001059b9:
    puts(
        "\nUsage: forestdb_hexamine [OPTION]... [filename]\n\n-  Loads entire file in memory and hangs in gdb_loop for examination\n\nOptions:\n\n      --print-header     displays KV info (for non-corrupted files)\n      --headers-only     only dump contents of all DB headers and exit\n      --max-filesize     reset maximum file size (default 1.5GB)"
        );
  }
  else {
    iVar2 = 1;
    do {
      __s1 = argv[iVar2];
      if ((*__s1 == '-') && (__s1[1] == '-')) {
        iVar1 = strncmp(__s1,"--print-header",0x10);
        if (iVar1 == 0) {
          opt->print_header = true;
        }
        else {
          iVar1 = strncmp(__s1,"--headers-only",0x10);
          if (iVar1 == 0) {
            opt->headers_only = true;
          }
          else {
            iVar1 = strncmp(__s1,"--max-filesize",0x10);
            if (iVar1 != 0) {
              printf("\nUnknown option %s\n",__s1);
              iVar2 = -2;
              goto LAB_001059b9;
            }
            __isoc99_sscanf(argv[(long)iVar2 + 1],"%lu",&opt->max_filesize);
            iVar2 = iVar2 + 1;
          }
        }
      }
      else {
        opt->filename = __s1;
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 < argc);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int parse_options(int argc, char **argv, struct input_option *opt)
{
    // Unfortunately, we cannot use getopt generally
    // because Windows doesn't support it ..
    int i = 1;

    if (argc < 2) {
        print_usage();
        return -1;
    }

    for (i = 1; i < argc; ++i) {
        if (argv[i][0] == '-' && argv[i][1] == '-') {
            if (strncmp(argv[i], "--print-header", 16) == 0) {
                opt->print_header = true;
            } else if (strncmp(argv[i], "--headers-only", 16) == 0) {
                opt->headers_only = true;
            } else if (strncmp(argv[i], "--max-filesize", 16) == 0) {
                sscanf(argv[++i], "%" _F64, &opt->max_filesize);
            } else {
                printf("\nUnknown option %s\n", argv[i]);
                print_usage();
                return -2;
            }
        } else {
            opt->filename = argv[i];
        }
    }

    return 0;
}